

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

Instr * __thiscall
Inline::InlinePolymorphicFunctionUsingFixedMethods
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,StackSym *symCallerThis,
          ProfileId profileId,PropertySymOpnd *methodValueOpnd,bool *pIsInlined,
          uint recursiveInlineDepth)

{
  OpCode OVar1;
  StackSym *pSVar2;
  _func_int **pp_Var3;
  SymOpnd *this_00;
  Func *pFVar4;
  code *pcVar5;
  bool bVar6;
  OpndKind OVar7;
  bool bVar8;
  ArgSlot AVar9;
  uint16 cachedFixedInlineeCount;
  uint uVar10;
  TypeId TVar11;
  FunctionJITTimeInfo *pFVar12;
  undefined4 *puVar13;
  FunctionJITTimeInfo *pFVar14;
  JITTimeFunctionBody *pJVar15;
  char16 *pcVar16;
  Inline *pIVar17;
  char16 *pcVar18;
  char16 *pcVar19;
  Instr *pIVar20;
  char *this_01;
  char16 *pcVar21;
  Instr *pIVar22;
  intptr_t iVar23;
  FixedFieldInfo *this_02;
  intptr_t iVar24;
  undefined7 extraout_var;
  FixedFieldInfo *pFVar25;
  LabelInstr *pLVar26;
  Opnd *pOVar27;
  FunctionJITRuntimeInfo *inlineeRuntimeData;
  JITType *pJVar28;
  AddrOpnd *pAVar29;
  BranchInstr *pBVar30;
  JITTypeHolder JVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  PropertySymOpnd *pPVar35;
  RegOpnd *src1Opnd;
  char16_t *form;
  undefined6 in_register_00000082;
  FunctionJITTimeInfo *this_03;
  uint i;
  uint uVar36;
  wchar local_198 [4];
  char16 debugStringBuffer2 [42];
  wchar local_138 [4];
  char16 debugStringBuffer [42];
  FunctionJITTimeInfo *pFStack_d8;
  FunctionJITTimeInfo *inlineesDataArray [4];
  JITTypeHolderBase<void> local_a8;
  LabelInstr *local_a0;
  Instr *local_98;
  RegOpnd *local_90;
  FixedFieldInfo *local_88;
  Instr *local_80;
  PropertySymOpnd *local_78;
  AddrOpnd *local_70;
  FunctionJITTimeInfo *local_68;
  StackSym *local_60;
  RegOpnd *local_58;
  uint local_4c;
  Inline *local_48;
  LabelInstr *local_40;
  bool local_31 [8];
  bool safeThis;
  
  pIVar22 = callInstr->m_next;
  *pIsInlined = false;
  local_58 = (RegOpnd *)CONCAT44(local_58._4_4_,(int)CONCAT62(in_register_00000082,profileId));
  local_60 = symCallerThis;
  local_48 = this;
  local_40 = (LabelInstr *)inlinerData;
  pFVar12 = FunctionJITTimeInfo::GetInlinee(inlinerData,profileId);
  if (pFVar12 == (FunctionJITTimeInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x2d5,"(inlineeJitTimeData)","inlineeJitTimeData");
    if (!bVar6) goto LAB_00548695;
    *puVar13 = 0;
  }
  pFVar14 = FunctionJITTimeInfo::GetNext(pFVar12);
  if (pFVar14 == (FunctionJITTimeInfo *)0x0) {
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,PolymorphicInlinePhase);
    if (!bVar6) goto LAB_00547752;
    pJVar15 = FunctionJITTimeInfo::GetBody(pFVar12);
    local_48 = (Inline *)JITTimeFunctionBody::GetDisplayName(pJVar15);
    pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar12,(wchar (*) [42])local_138);
    pLVar26 = local_40;
    pJVar15 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
    pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar15);
    pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet
                        ((FunctionJITTimeInfo *)pLVar26,(wchar (*) [42])local_198);
    Output::Print(L"INLINING (Polymorphic): Skip Inline: Missing JitTime data \tInlinee: %s (%s):\tCaller: %s (%s)\n"
                  ,local_48,pcVar16,pcVar18,pcVar19);
  }
  else {
    if ((callInstr->m_src2 != (Opnd *)0x0) &&
       (OVar7 = IR::Opnd::GetKind(callInstr->m_src2), OVar7 == OpndKindSym)) {
      pOVar27 = callInstr->m_src2;
      OVar7 = IR::Opnd::GetKind(pOVar27);
      if (OVar7 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar6) goto LAB_00548695;
        *puVar13 = 0;
      }
      pSVar2 = (StackSym *)pOVar27[1]._vptr_Opnd;
      if ((pSVar2->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar6) goto LAB_00548695;
        *puVar13 = 0;
      }
      AVar9 = StackSym::GetArgSlotNum(pSVar2);
      if (0xf < AVar9) {
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,PolymorphicInlinePhase);
        if (!bVar6) goto LAB_00547752;
        local_98 = pIVar22;
        pJVar15 = FunctionJITTimeInfo::GetBody(pFVar12);
        pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar15);
        pIVar17 = (Inline *)
                  FunctionJITTimeInfo::GetDebugNumberSet(pFVar12,(wchar (*) [42])local_138);
        pOVar27 = callInstr->m_src2;
        OVar7 = IR::Opnd::GetKind(pOVar27);
        if (OVar7 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar6) goto LAB_00548695;
          *puVar13 = 0;
        }
        pSVar2 = (StackSym *)pOVar27[1]._vptr_Opnd;
        local_48 = pIVar17;
        if ((pSVar2->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar6) goto LAB_00548695;
          *puVar13 = 0;
        }
        AVar9 = StackSym::GetArgSlotNum(pSVar2);
        pLVar26 = local_40;
        pJVar15 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
        pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar15);
        pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet
                            ((FunctionJITTimeInfo *)pLVar26,(wchar (*) [42])local_198);
        Output::Print(L"INLINING (Polymorphic): Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"
                      ,pcVar16,local_48,(ulong)AVar9,0xf,pcVar18,pcVar19);
        Output::Flush();
        pIVar22 = local_98;
        goto LAB_00547752;
      }
    }
    iVar32 = 0;
    pFVar14 = pFVar12;
    do {
      pFVar14 = FunctionJITTimeInfo::GetNext(pFVar14);
      iVar32 = iVar32 + -1;
    } while (pFVar14 != (FunctionJITTimeInfo *)0x0);
    if (0xfffffffc < -iVar32 - 5U) {
      *pIsInlined = true;
      pIVar20 = callInstr;
      do {
        do {
          pIVar20 = pIVar20->m_prev;
          OVar1 = pIVar20->m_opcode;
        } while (OVar1 == Ld_A);
      } while (OVar1 == ArgOut_A);
      if (OVar1 != StartCall) {
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,PolymorphicInlinePhase);
        pLVar26 = local_40;
        if (bVar6) {
          pJVar15 = FunctionJITTimeInfo::GetBody(pFVar12);
          pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar15);
          pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar12,(wchar (*) [42])local_138);
          pJVar15 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pLVar26);
          pcVar19 = JITTimeFunctionBody::GetDisplayName(pJVar15);
          pcVar21 = FunctionJITTimeInfo::GetDebugNumberSet
                              ((FunctionJITTimeInfo *)pLVar26,(wchar (*) [42])local_198);
          Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: ArgOuts may have side effects Inlinee: %s (%s):\tCaller: %s (%s)\n"
                        ,pcVar16,pcVar18,pcVar19,pcVar21);
          Output::Flush();
        }
        goto LAB_00547b77;
      }
      local_70 = (AddrOpnd *)CONCAT44(local_70._4_4_,-iVar32);
      pOVar27 = callInstr->m_src1;
      local_98 = pIVar22;
      OVar7 = IR::Opnd::GetKind(pOVar27);
      if (OVar7 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar6) goto LAB_00548695;
        *puVar13 = 0;
      }
      pp_Var3 = pOVar27[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var3 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar6) goto LAB_00548695;
        *puVar13 = 0;
      }
      pIVar22 = (Instr *)pp_Var3[5];
      if ((*(byte *)(pp_Var3 + 3) & pIVar22 != (Instr *)0x0) == 0) {
        pIVar22 = InlinePolymorphicFunction
                            (local_48,callInstr,(FunctionJITTimeInfo *)local_40,local_60,
                             (ProfileId)local_58,pIsInlined,recursiveInlineDepth,true);
        return pIVar22;
      }
      OVar7 = IR::Opnd::GetKind(pIVar22->m_src1);
      if (OVar7 == OpndKindSym) {
        this_00 = (SymOpnd *)pIVar22->m_src1;
        local_80 = pIVar22;
        OVar7 = IR::Opnd::GetKind((Opnd *)this_00);
        if (OVar7 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar6) goto LAB_00548695;
          *puVar13 = 0;
        }
        bVar6 = IR::SymOpnd::IsPropertySymOpnd(this_00);
        if (!bVar6) goto LAB_00547ae3;
        this_01 = (char *)IR::Opnd::AsPropertySymOpnd(local_80->m_src1);
        if (((PropertySymOpnd *)this_01)->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
          bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,PolymorphicInlinePhase);
          if (!bVar6) goto LAB_00547b67;
          pJVar15 = FunctionJITTimeInfo::GetBody(pFVar12);
          pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar15);
          pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar12,(wchar (*) [42])local_138);
          pLVar26 = local_40;
          pJVar15 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
          pcVar21 = JITTimeFunctionBody::GetDisplayName(pJVar15);
          pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                              ((FunctionJITTimeInfo *)pLVar26,(wchar (*) [42])local_198);
          form = 
          L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: no ObjTypeSpecFldInfo to get Fixed Methods from Inlinee: %s (%s):\tCaller: %s (%s)\n"
          ;
          goto LAB_00547b4f;
        }
        bVar6 = ObjTypeSpecFldInfo::HasFixedValue(((PropertySymOpnd *)this_01)->objTypeSpecFldInfo);
        if (!bVar6) {
          bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,PolymorphicInlinePhase);
          if (bVar6) {
            pJVar15 = FunctionJITTimeInfo::GetBody(pFVar12);
            pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar15);
            pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar12,(wchar (*) [42])local_138);
            pLVar26 = local_40;
            pJVar15 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
            pcVar21 = JITTimeFunctionBody::GetDisplayName(pJVar15);
            pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                                ((FunctionJITTimeInfo *)pLVar26,(wchar (*) [42])local_198);
            form = 
            L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: ObjTypeSpecFldInfo doesn\'t have Fixed Methods for one or some of the inlinees Inlinee: %s (%s):\tCaller: %s (%s)\n"
            ;
            goto LAB_00547b4f;
          }
          goto LAB_00547b67;
        }
        cachedFixedInlineeCount =
             IR::PropertySymOpnd::GetFixedFieldCount((PropertySymOpnd *)this_01);
        local_4c = (uint)cachedFixedInlineeCount;
        if (1 < cachedFixedInlineeCount) {
          local_78 = (PropertySymOpnd *)this_01;
          local_88 = IR::PropertySymOpnd::GetFixedFieldInfoArray((PropertySymOpnd *)this_01);
          uVar10 = HandleDifferentTypesSameFunction
                             ((Inline *)this_01,local_88,cachedFixedInlineeCount);
          pFVar25 = local_88;
          if (iVar32 + uVar10 == 0) {
            if (4 < cachedFixedInlineeCount) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar13 = 1;
              this_01 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
              ;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x359,
                                 "(cachedFixedInlineeCount <= Js::DynamicProfileInfo::maxPolymorphicInliningSize)"
                                 ,
                                 "cachedFixedInlineeCount <= Js::DynamicProfileInfo::maxPolymorphicInliningSize"
                                );
              if (!bVar6) goto LAB_00548695;
              *puVar13 = 0;
            }
            inlineesDataArray[1] = (FunctionJITTimeInfo *)0x0;
            inlineesDataArray[2] = (FunctionJITTimeInfo *)0x0;
            pFStack_d8 = (FunctionJITTimeInfo *)0x0;
            inlineesDataArray[0] = (FunctionJITTimeInfo *)0x0;
            FillInlineesDataArrayUsingFixedMethods
                      ((Inline *)this_01,pFVar12,&pFStack_d8,4,pFVar25,(uint16)local_4c);
            pFVar14 = (FunctionJITTimeInfo *)__tls_get_addr(&PTR_0155fe48);
            if (pFStack_d8 == (FunctionJITTimeInfo *)0x0) {
              bVar6 = true;
            }
            else {
              bVar6 = true;
              uVar34 = 0;
              this_03 = pFStack_d8;
              local_68 = pFVar14;
              do {
                bVar8 = FunctionJITTimeInfo::HasBody(this_03);
                if (!bVar8) break;
                pJVar15 = FunctionJITTimeInfo::GetBody(this_03);
                pFVar25 = local_88;
                if (pJVar15 != (JITTimeFunctionBody *)0x0) {
                  iVar23 = FunctionJITTimeInfo::GetFunctionInfoAddr(this_03);
                  this_02 = IR::PropertySymOpnd::GetFixedFunction(local_78,(uint)uVar34);
                  iVar24 = FixedFieldInfo::GetFuncInfoAddr(this_02);
                  if (iVar23 != iVar24) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    pFVar14 = local_68;
                    (pFVar14->m_data).isAggressiveInliningEnabled = '\x01';
                    (pFVar14->m_data).isInlined = '\0';
                    (pFVar14->m_data).struct_pad_0 = 0;
                    bVar6 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                       ,0x369,"(false)",
                                       "inlineesDataArray and fixedfunctionInfoArray should be aligned with each other at this point"
                                      );
                    if (!bVar6) goto LAB_00548695;
                    (pFVar14->m_data).isAggressiveInliningEnabled = '\0';
                    (pFVar14->m_data).isInlined = '\0';
                    (pFVar14->m_data).struct_pad_0 = 0;
                  }
                }
                do {
                  bVar6 = FixedFieldInfo::NextHasSameFixedField(pFVar25 + uVar34);
                  pIVar22 = (Instr *)CONCAT71(extraout_var,bVar6);
                  uVar36 = (int)uVar34 + 1;
                  uVar34 = (ulong)uVar36;
                } while (bVar6);
                bVar6 = uVar36 < local_4c;
                if (!bVar6) goto LAB_00547f52;
                this_03 = inlineesDataArray[(ulong)uVar36 - 1];
              } while (this_03 != (FunctionJITTimeInfo *)0x0);
            }
            bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,PolymorphicInlinePhase);
            pLVar26 = local_40;
            if (bVar8) {
              pJVar15 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
              pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar15);
              pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet
                                  ((FunctionJITTimeInfo *)pLVar26,(wchar (*) [42])local_138);
              Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: One of the inlinees doesn\'t have the corresponding object/prototype\'s type cached\tCaller: %s (%s)\n"
                            ,pcVar16,pcVar18);
              Output::Flush();
            }
            pIVar22 = InlinePolymorphicFunction
                                (local_48,callInstr,(FunctionJITTimeInfo *)local_40,local_60,
                                 (ProfileId)local_58,pIsInlined,recursiveInlineDepth,true);
LAB_00547f52:
            if (bVar6) {
              return pIVar22;
            }
            local_31[0] = true;
            uVar36 = 0;
            uVar34 = 1;
            local_90 = (RegOpnd *)pFStack_d8;
            local_a0 = (LabelInstr *)pIVar22;
            do {
              iVar23 = IR::PropertySymOpnd::GetFieldValue(local_78,uVar36);
              pPVar35 = local_78;
              local_68 = (FunctionJITTimeInfo *)CONCAT71(local_68._1_7_,(char)uVar34);
              if (iVar23 == 0) {
                bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,PolymorphicInlinePhase);
                if (bVar6) {
                  pFVar12 = inlineesDataArray[(ulong)uVar36 - 1];
                  pJVar15 = FunctionJITTimeInfo::GetBody(pFVar12);
                  pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar15);
                  pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet
                                      (pFVar12,(wchar (*) [42])local_138);
                  pLVar26 = local_40;
                  pJVar15 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
                  pcVar19 = JITTimeFunctionBody::GetDisplayName(pJVar15);
                  pcVar21 = FunctionJITTimeInfo::GetDebugNumberSet
                                      ((FunctionJITTimeInfo *)pLVar26,(wchar (*) [42])local_198);
                  uVar34 = (ulong)local_68 & 0xff;
                  Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: no fixed method for one of the inlinees; Inlinee: %s (%s):\tCaller: %s (%s)\n"
                                ,pcVar16,pcVar18,pcVar19,pcVar21);
LAB_00548192:
                  Output::Flush();
                }
LAB_00548197:
                pLVar26 = (LabelInstr *)
                          InlinePolymorphicFunction
                                    (local_48,callInstr,(FunctionJITTimeInfo *)local_40,local_60,
                                     (ProfileId)local_58,pIsInlined,recursiveInlineDepth,true);
                break;
              }
              if (uVar36 == 0) {
                bVar6 = TryOptimizeCallInstrWithFixedMethod
                                  (local_48,callInstr,(FunctionJITTimeInfo *)local_90,true,false,
                                   false,true,local_31,true,0);
                pPVar35 = local_78;
                if (!bVar6) {
LAB_00548100:
                  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,PolymorphicInlinePhase);
                  uVar34 = (ulong)local_68 & 0xff;
                  if (bVar6) {
                    pJVar15 = FunctionJITTimeInfo::GetBody(pFVar12);
                    pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar15);
                    pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet
                                        (pFVar12,(wchar (*) [42])local_138);
                    pJVar15 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
                    pcVar19 = JITTimeFunctionBody::GetDisplayName(pJVar15);
                    pcVar21 = FunctionJITTimeInfo::GetDebugNumberSet
                                        ((FunctionJITTimeInfo *)local_40,(wchar (*) [42])local_198);
                    Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: can\'t optimize using Fixed Methods %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                                  ,(ulong)local_70 & 0xffffffff,4,pcVar16,pcVar18,pcVar19,pcVar21);
                    goto LAB_00548192;
                  }
                  goto LAB_00548197;
                }
              }
              else {
                pFVar25 = IR::PropertySymOpnd::GetFixedFunction(local_78,uVar36);
                if (pFVar25 != (FixedFieldInfo *)0x0) {
                  pFVar25 = IR::PropertySymOpnd::GetFixedFunction(pPVar35,uVar36);
                  iVar23 = FixedFieldInfo::GetFuncInfoAddr(pFVar25);
                  iVar24 = FunctionJITTimeInfo::GetFunctionInfoAddr
                                     (inlineesDataArray[(ulong)uVar36 - 1]);
                  if (iVar23 != iVar24) goto LAB_00548100;
                }
              }
              TVar11 = IR::PropertySymOpnd::GetTypeId(pPVar35,uVar36);
              pFVar25 = local_88;
              if (0x3a < TVar11 - TypeIds_HostDispatch) {
                local_31[0] = false;
              }
              do {
                bVar6 = FixedFieldInfo::NextHasSameFixedField(pFVar25 + uVar36);
                uVar36 = uVar36 + 1;
              } while (bVar6);
              uVar34 = (ulong)(uVar36 < local_4c);
              pLVar26 = local_a0;
            } while (uVar36 < local_4c);
            pIVar22 = local_80;
            if ((uVar34 & 1) != 0) {
              return &pLVar26->super_Instr;
            }
            if ((local_78->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
               (bVar6 = ObjTypeSpecFldInfo::IsPoly(local_78->objTypeSpecFldInfo), !bVar6)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar13 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x3a0,"(methodPropertyOpnd->IsPoly())",
                                 "methodPropertyOpnd->IsPoly()");
              if (!bVar6) {
LAB_00548695:
                pcVar5 = (code *)invalidInstructionException();
                (*pcVar5)();
              }
              *puVar13 = 0;
            }
            local_58 = IR::RegOpnd::New(TyVar,callInstr->m_func);
            pIVar22 = IR::Instr::New(CheckPropertyGuardAndLoadType,&local_58->super_Opnd,
                                     pIVar22->m_src1,callInstr->m_func);
            IR::Instr::InsertBefore(local_80,pIVar22);
            IR::Instr::SetByteCodeOffset(pIVar22,local_80);
            IR::Instr::ConvertToBailOutInstr
                      (pIVar22,local_80,BailOutFailedFixedFieldCheck,0xffffffff);
            local_70 = (AddrOpnd *)&DAT_015d3490;
            bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,PolymorphicInlinePhase);
            if (bVar6) {
              Output::Print(L"------------------------------------------------\n");
              Output::Flush();
            }
            uVar34 = 0;
            uVar36 = local_4c;
            do {
              pFVar12 = inlineesDataArray[uVar34 - 1];
              pJVar15 = FunctionJITTimeInfo::GetBody(pFVar12);
              bVar6 = Js::Phases::IsEnabled((Phases *)local_70,PolymorphicInlinePhase);
              pFVar25 = local_88;
              if (bVar6) {
                local_68 = (FunctionJITTimeInfo *)JITTimeFunctionBody::GetDisplayName(pJVar15);
                pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar12,(wchar (*) [42])local_138);
                pLVar26 = local_40;
                pJVar15 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
                JITTimeFunctionBody::GetDisplayName(pJVar15);
                FunctionJITTimeInfo::GetDebugNumberSet
                          ((FunctionJITTimeInfo *)pLVar26,(wchar (*) [42])local_198);
                uVar36 = local_4c;
                Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Start inlining: \tInlinee: %s (%s):\tCaller: %s (%s)\n"
                              ,local_68,pcVar16);
                Output::Flush();
                pFVar25 = local_88;
              }
              do {
                bVar6 = FixedFieldInfo::NextHasSameFixedField(pFVar25 + uVar34);
                uVar33 = (int)uVar34 + 1;
                uVar34 = (ulong)uVar33;
              } while (bVar6);
            } while (uVar33 < uVar36);
            bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,PolymorphicInlinePhase);
            if (bVar6) {
              Output::Print(L"------------------------------------------------\n");
              Output::Flush();
            }
            uVar34 = 0;
            if (callInstr->m_dst == (Opnd *)0x0) {
              local_90 = (RegOpnd *)0x0;
            }
            else {
              pOVar27 = IR::Instr::UnlinkDst(callInstr);
              local_90 = IR::Opnd::AsRegOpnd(pOVar27);
            }
            IR::Instr::MoveArgs(callInstr,true);
            callInstr->m_opcode = CallIFixed;
            local_a0 = IR::LabelInstr::New(Label,callInstr->m_func,false);
            pLVar26 = IR::LabelInstr::New(Label,callInstr->m_func,false);
            IR::Instr::InsertBefore(callInstr,&pLVar26->super_Instr);
            inlineesDataArray[3] = (FunctionJITTimeInfo *)(ulong)(local_31[0] & 1);
            pPVar35 = local_78;
            do {
              local_40 = IR::LabelInstr::New(Label,callInstr->m_func,false);
              IR::Instr::InsertBefore(callInstr,&local_40->super_Instr);
              uVar10 = (uint)uVar34;
              iVar23 = IR::PropertySymOpnd::GetFieldValue(pPVar35,uVar10);
              local_70 = IR::AddrOpnd::New(iVar23,AddrOpndKindDynamicVar,callInstr->m_func,false,
                                           (Var)0x0);
              local_70->field_0x28 = local_70->field_0x28 | 2;
              pFVar25 = IR::PropertySymOpnd::GetFixedFieldInfoArray(pPVar35);
              pAVar29 = local_70;
              local_70->m_metadata = pFVar25 + uVar34;
              local_68 = inlineesDataArray[uVar34 - 1];
              inlineeRuntimeData = FunctionJITTimeInfo::GetRuntimeInfo(local_68);
              InsertOneInlinee(local_48,callInstr,local_90,&pAVar29->super_Opnd,local_68,
                               inlineeRuntimeData,local_a0,local_60,SUB81(inlineesDataArray[3],0),
                               recursiveInlineDepth);
              bVar6 = FixedFieldInfo::NextHasSameFixedField(local_88 + uVar34);
              pPVar35 = local_78;
              src1Opnd = local_58;
              if (bVar6) {
                do {
                  uVar10 = (uint)uVar34;
                  local_a8.t = (Type)IR::PropertySymOpnd::GetType(pPVar35,uVar10);
                  pJVar28 = JITTypeHolderBase<void>::operator->(&local_a8);
                  iVar23 = JITType::GetAddr(pJVar28);
                  pAVar29 = IR::AddrOpnd::New(iVar23,AddrOpndKindDynamicType,
                                              (pLVar26->super_Instr).m_func,false,(Var)0x0);
                  pBVar30 = IR::BranchInstr::New
                                      (BrAddr_A,local_40,&src1Opnd->super_Opnd,&pAVar29->super_Opnd,
                                       (pLVar26->super_Instr).m_func);
                  IR::Instr::InsertBefore(&pLVar26->super_Instr,&pBVar30->super_Instr);
                  pFVar4 = local_48->topFunc;
                  JVar31 = IR::PropertySymOpnd::GetType(pPVar35,uVar10);
                  src1Opnd = local_58;
                  Func::PinTypeRef(pFVar4,JVar31.t);
                  uVar10 = uVar10 + 1;
                  uVar34 = (ulong)uVar10;
                  bVar6 = FixedFieldInfo::NextHasSameFixedField(local_88 + uVar34);
                } while (bVar6);
              }
              local_a8.t = (Type)IR::PropertySymOpnd::GetType(pPVar35,uVar10);
              pJVar28 = JITTypeHolderBase<void>::operator->(&local_a8);
              iVar23 = JITType::GetAddr(pJVar28);
              pAVar29 = IR::AddrOpnd::New(iVar23,AddrOpndKindDynamicType,
                                          (pLVar26->super_Instr).m_func,false,(Var)0x0);
              pBVar30 = IR::BranchInstr::New
                                  (BrAddr_A,local_40,&src1Opnd->super_Opnd,&pAVar29->super_Opnd,
                                   (pLVar26->super_Instr).m_func);
              IR::Instr::InsertBefore(&pLVar26->super_Instr,&pBVar30->super_Instr);
              pFVar4 = local_48->topFunc;
              JVar31 = IR::PropertySymOpnd::GetType(pPVar35,uVar10);
              Func::PinTypeRef(pFVar4,JVar31.t);
              pIVar22 = local_80;
              uVar34 = (ulong)(uVar10 + 1);
            } while (uVar10 + 1 < local_4c);
            pIVar20 = local_80;
            IR::Instr::Unlink(local_80);
            pIVar22->m_opcode = LdMethodFldPolyInlineMiss;
            CompletePolymorphicInlining
                      ((Inline *)pIVar20,callInstr,local_90,local_a0,&pLVar26->super_Instr,pIVar22,
                       BailOutOnFailedPolymorphicInlineTypeCheck);
            pIVar17 = local_48;
            Func::SetHasInlinee(local_48->topFunc);
            pIVar20 = local_98;
            InsertStatementBoundary(pIVar17,local_98);
            InsertStatementBoundary(pIVar17,pIVar22);
            return pIVar20;
          }
          bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,PolymorphicInlinePhase);
          if (bVar6) {
            pJVar15 = FunctionJITTimeInfo::GetBody(pFVar12);
            local_98 = (Instr *)JITTimeFunctionBody::GetDisplayName(pJVar15);
            pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar12,(wchar (*) [42])local_138);
            pLVar26 = local_40;
            pJVar15 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
            pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar15);
            pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet
                                ((FunctionJITTimeInfo *)pLVar26,(wchar (*) [42])local_198);
            Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: cached fixed function count (%d) doesn\'t match inlinee count (%d); (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                          ,(ulong)uVar10,(ulong)local_70 & 0xffffffff,4,local_98,pcVar16,pcVar18,
                          pcVar19);
            goto LAB_00547b62;
          }
          goto LAB_00547b67;
        }
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,PolymorphicInlinePhase);
        if (!bVar6) goto LAB_00547b67;
        pJVar15 = FunctionJITTimeInfo::GetBody(pFVar12);
        pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar15);
        pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar12,(wchar (*) [42])local_138);
        pLVar26 = local_40;
        pJVar15 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
        pcVar19 = JITTimeFunctionBody::GetDisplayName(pJVar15);
        pcVar21 = FunctionJITTimeInfo::GetDebugNumberSet
                            ((FunctionJITTimeInfo *)pLVar26,(wchar (*) [42])local_198);
        Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: fixed function count too less %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                      ,(ulong)local_4c,4,pcVar16,pcVar18,pcVar19,pcVar21);
LAB_00547b62:
        Output::Flush();
      }
      else {
LAB_00547ae3:
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,PolymorphicInlinePhase);
        if (bVar6) {
          pJVar15 = FunctionJITTimeInfo::GetBody(pFVar12);
          pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar15);
          pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar12,(wchar (*) [42])local_138);
          pLVar26 = local_40;
          pJVar15 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
          pcVar21 = JITTimeFunctionBody::GetDisplayName(pJVar15);
          pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                              ((FunctionJITTimeInfo *)pLVar26,(wchar (*) [42])local_198);
          form = 
          L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: Did not find property sym operand for the method load Inlinee: %s (%s):\tCaller: %s (%s)\n"
          ;
LAB_00547b4f:
          Output::Print(form,pcVar18,pcVar19,pcVar21,pcVar16);
          goto LAB_00547b62;
        }
      }
LAB_00547b67:
      pLVar26 = local_40;
LAB_00547b77:
      pIVar22 = InlinePolymorphicFunction
                          (local_48,callInstr,(FunctionJITTimeInfo *)pLVar26,local_60,
                           (ProfileId)local_58,pIsInlined,recursiveInlineDepth,true);
      return pIVar22;
    }
    local_70 = (AddrOpnd *)CONCAT44(local_70._4_4_,-iVar32);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,PolymorphicInlinePhase);
    if (!bVar6) goto LAB_00547752;
    pJVar15 = FunctionJITTimeInfo::GetBody(pFVar12);
    local_48 = (Inline *)JITTimeFunctionBody::GetDisplayName(pJVar15);
    pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar12,(wchar (*) [42])local_138);
    pLVar26 = local_40;
    pJVar15 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_40);
    pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar15);
    pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet
                        ((FunctionJITTimeInfo *)pLVar26,(wchar (*) [42])local_198);
    Output::Print(L"INLINING (Polymorphic): Skip Inline: Inlinee count either too small or too large: InlineeCount %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                  ,(ulong)local_70 & 0xffffffff,4,local_48,pcVar16,pcVar18,pcVar19);
  }
  Output::Flush();
LAB_00547752:
  if (methodValueOpnd != (PropertySymOpnd *)0x0) {
    bVar6 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo(methodValueOpnd);
    if (bVar6) {
      methodValueOpnd->objTypeSpecFldInfo = (ObjTypeSpecFldInfo *)0x0;
      methodValueOpnd->field_0x61 = methodValueOpnd->field_0x61 & 0xfe;
      methodValueOpnd->slotIndex = 0;
    }
    if (((methodValueOpnd != (PropertySymOpnd *)0x0) &&
        (methodValueOpnd->m_runtimePolymorphicInlineCache != (JITTimePolymorphicInlineCache *)0x0))
       && (-1 < (char)methodValueOpnd->m_polyCacheUtil)) {
      methodValueOpnd->m_runtimePolymorphicInlineCache = (JITTimePolymorphicInlineCache *)0x0;
    }
  }
  return pIVar22;
}

Assistant:

IR::Instr *
Inline::InlinePolymorphicFunctionUsingFixedMethods(IR::Instr *callInstr, const FunctionJITTimeInfo * inlinerData, const StackSym *symCallerThis, const Js::ProfileId profileId, IR::PropertySymOpnd* methodValueOpnd, bool* pIsInlined, uint recursiveInlineDepth)
{
    IR::Instr* instrNext = callInstr->m_next;
    *pIsInlined = false;

    const FunctionJITTimeInfo* inlineeJitTimeData = inlinerData->GetInlinee(profileId);
    AnalysisAssert(inlineeJitTimeData);

#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    // Abort conditions:
    if(!inlineeJitTimeData->GetNext())
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Missing JitTime data \tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                 inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                 inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        // There are no multiple codegen jit-time data allocated for this call site, not sure how is this possible, abort
        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
        return instrNext;
    }

    // arguments exceed MaxInlineeArgoutCount
    if (callInstr->GetSrc2() &&
        callInstr->GetSrc2()->IsSymOpnd() &&
        callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
    {
        // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo. Although
        // InliningDecider already checks for this, the check is against profile data that may not be accurate since profile
        // data matching does not take into account some types of changes to source code. Need to check this again with current
        // information.
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"),
            inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer) , callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum(),
            Js::InlineeCallInfo::MaxInlineeArgoutCount, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
        return instrNext;
    }

    uint inlineeCount = 0;
    const FunctionJITTimeInfo * tmpInlineeJitTimeData = inlineeJitTimeData;
    while(tmpInlineeJitTimeData)
    {
        inlineeCount++;
        tmpInlineeJitTimeData = tmpInlineeJitTimeData->GetNext();
    }

    // Inlinee count too small (<2) or too large (>4)
    if (inlineeCount < 2 || inlineeCount > Js::DynamicProfileInfo::maxPolymorphicInliningSize)
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Inlinee count either too small or too large: InlineeCount %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
        return instrNext;
    }

    *pIsInlined = true;

    IR::Instr* tmpInstr = callInstr->m_prev;
    while (tmpInstr->m_opcode != Js::OpCode::StartCall)
    {
        if ((tmpInstr->m_opcode != Js::OpCode::ArgOut_A) && (tmpInstr->m_opcode != Js::OpCode::Ld_A))
        {
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: ArgOuts may have side effects Inlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
            return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
        }
        tmpInstr = tmpInstr->m_prev;
    }

    StackSym* methodValueSym = callInstr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym();
    if (!methodValueSym->IsSingleDef())
    {
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    IR::Instr* ldMethodFldInstr = methodValueSym->GetInstrDef();
    if (!(ldMethodFldInstr->GetSrc1()->IsSymOpnd() && ldMethodFldInstr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()))
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: Did not find property sym operand for the method load Inlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    IR::PropertySymOpnd* methodPropertyOpnd = ldMethodFldInstr->GetSrc1()->AsPropertySymOpnd();
    if (!methodPropertyOpnd->HasObjTypeSpecFldInfo())
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: no ObjTypeSpecFldInfo to get Fixed Methods from Inlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    if (!methodPropertyOpnd->HasFixedValue())
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: ObjTypeSpecFldInfo doesn't have Fixed Methods for one or some of the inlinees Inlinee: %s (%s):\tCaller: %s (%s)\n"),

                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    uint16 cachedFixedInlineeCount = methodPropertyOpnd->GetFixedFieldCount();
    if (cachedFixedInlineeCount < 2)
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: fixed function count too less %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    cachedFixedInlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    FixedFieldInfo* fixedFunctionInfoArray = methodPropertyOpnd->GetFixedFieldInfoArray();

    // It might so be the case that two objects of different types call the same function (body), for e.g., if they share the prototype on which the function is defined.
    uint uniqueFixedFunctionCount = HandleDifferentTypesSameFunction(fixedFunctionInfoArray, cachedFixedInlineeCount);

    if (uniqueFixedFunctionCount != inlineeCount)
    {
        // inlineeCount obtained from the inlineeJitTimeData is more accurate than cached number of fixed methods for inlinees.
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: cached fixed function count (%d) doesn't match inlinee count (%d); (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    uniqueFixedFunctionCount, inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    Assert(cachedFixedInlineeCount <= Js::DynamicProfileInfo::maxPolymorphicInliningSize);
    const FunctionJITTimeInfo* inlineesDataArray[Js::DynamicProfileInfo::maxPolymorphicInliningSize] = {};

    FillInlineesDataArrayUsingFixedMethods(inlineeJitTimeData, inlineesDataArray, Js::DynamicProfileInfo::maxPolymorphicInliningSize, fixedFunctionInfoArray, cachedFixedInlineeCount);

    for (uint i = 0; i < cachedFixedInlineeCount; i++)
    {
        if(!inlineesDataArray[i] || !inlineesDataArray[i]->HasBody())
        {
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: One of the inlinees doesn't have the corresponding object/prototype's type cached\tCaller: %s (%s)\n"),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
            return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
        }
#if DBG
        if(inlineesDataArray[i]->GetBody() && inlineesDataArray[i]->GetFunctionInfoAddr() != methodPropertyOpnd->GetFixedFunction(i)->GetFuncInfoAddr())
        {
            AssertMsg(false, "inlineesDataArray and fixedfunctionInfoArray should be aligned with each other at this point");
        }
#endif
        while (fixedFunctionInfoArray[i].NextHasSameFixedField())
        {
            i++;
        }
    }

    bool safeThis = true; // Eliminate CheckThis for inlining.
    for (uint i = 0; i < cachedFixedInlineeCount; i++)
    {
        if (!methodPropertyOpnd->GetFieldValue(i))
        {
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: no fixed method for one of the inlinees; Inlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineesDataArray[i]->GetBody()->GetDisplayName(), inlineesDataArray[i]->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
            return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
        }
        if (i == 0)
        {
            // Do all the general, non-function-object-specific checks just once.
            if (!TryOptimizeCallInstrWithFixedMethod(callInstr, inlineesDataArray[i], true, false, false, true /*isInlined*/, safeThis, true /*dontOptimizeJustCheck*/, i))
            {
                POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: can't optimize using Fixed Methods %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
                return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
            }
        }
        else
        {
            if (methodPropertyOpnd->GetFixedFunction(i) &&
                methodPropertyOpnd->GetFixedFunction(i)->GetFuncInfoAddr() != inlineesDataArray[i]->GetFunctionInfoAddr())
            {
                POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: can't optimize using Fixed Methods %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
                return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth,  true);
            }
        }
        Js::TypeId typeId = methodPropertyOpnd->GetTypeId(i);
        if(!(typeId > Js::TypeIds_LastJavascriptPrimitiveType && typeId <= Js::TypeIds_LastTrueJavascriptObjectType))
        {
            // Don't eliminate CheckThis if it cannot be done for any one of the inlinees
            safeThis = false;
        }
        while (fixedFunctionInfoArray[i].NextHasSameFixedField())
        {
            i++;
        }
    }

    Assert(methodPropertyOpnd->IsPoly());

    // emit property guard check for the method load, and load type
    IR::RegOpnd *typeOpnd = IR::RegOpnd::New(TyVar, callInstr->m_func);
    IR::Instr* propertyGuardCheckInstr = IR::Instr::New(Js::OpCode::CheckPropertyGuardAndLoadType, typeOpnd, ldMethodFldInstr->GetSrc1(), callInstr->m_func);
    ldMethodFldInstr->InsertBefore(propertyGuardCheckInstr);
    propertyGuardCheckInstr->SetByteCodeOffset(ldMethodFldInstr);
    propertyGuardCheckInstr = propertyGuardCheckInstr->ConvertToBailOutInstr(ldMethodFldInstr, IR::BailOutFailedFixedFieldCheck);

    POLYMORPHIC_INLINE_TESTTRACE(_u("------------------------------------------------\n"));
    for (uint i = 0; i < cachedFixedInlineeCount; i++)
    {
        JITTimeFunctionBody *inlineeFunctionBody = inlineesDataArray[i]->GetBody();
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Start inlining: \tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeFunctionBody->GetDisplayName(), inlineesDataArray[i]->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        while (fixedFunctionInfoArray[i].NextHasSameFixedField())
        {
            i++;
        }
    }
    POLYMORPHIC_INLINE_TESTTRACE(_u("------------------------------------------------\n"));

    IR::RegOpnd * returnValueOpnd;
    if (callInstr->GetDst())
    {
        returnValueOpnd = callInstr->UnlinkDst()->AsRegOpnd();
    }
    else
    {
        returnValueOpnd = nullptr;
    }

    callInstr->MoveArgs(/*generateByteCodeCapture*/ true);

    callInstr->m_opcode = Js::OpCode::CallIFixed;

    // iterate over inlineesDataArray to emit each inlinee
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, false);
    IR::Instr* dispatchStartLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, false);
    callInstr->InsertBefore(dispatchStartLabel);
    for(uint i=0; i < cachedFixedInlineeCount; i++)
    {
        IR::LabelInstr* inlineeStartLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func);
        callInstr->InsertBefore(inlineeStartLabel);

        IR::AddrOpnd * constMethodValueOpnd = IR::AddrOpnd::New(methodPropertyOpnd->GetFieldValue(i), IR::AddrOpndKind::AddrOpndKindDynamicVar, callInstr->m_func);
        constMethodValueOpnd->m_isFunction = true;
        constMethodValueOpnd->m_metadata = &methodPropertyOpnd->GetFixedFieldInfoArray()[i];

        InsertOneInlinee(callInstr, returnValueOpnd, constMethodValueOpnd, inlineesDataArray[i], inlineesDataArray[i]->GetRuntimeInfo(), doneLabel, symCallerThis, safeThis, recursiveInlineDepth);
        while (fixedFunctionInfoArray[i].NextHasSameFixedField())
        {
            dispatchStartLabel->InsertBefore(IR::BranchInstr::New(Js::OpCode::BrAddr_A, inlineeStartLabel, typeOpnd, IR::AddrOpnd::New(methodPropertyOpnd->GetType(i)->GetAddr(),
                IR::AddrOpndKindDynamicType, dispatchStartLabel->m_func), dispatchStartLabel->m_func));
            this->topFunc->PinTypeRef(methodPropertyOpnd->GetType(i).t); // Keep the types alive as the types may not be equivalent and, hence, won't be kept alive by EquivalentTypeCache
            i++;
        }

        dispatchStartLabel->InsertBefore(IR::BranchInstr::New(Js::OpCode::BrAddr_A, inlineeStartLabel,
            typeOpnd, IR::AddrOpnd::New(methodPropertyOpnd->GetType(i)->GetAddr(), IR::AddrOpndKindDynamicType, dispatchStartLabel->m_func), dispatchStartLabel->m_func));
        this->topFunc->PinTypeRef(methodPropertyOpnd->GetType(i).t); // Keep the types alive as the types may not be equivalent and, hence, won't be kept alive by EquivalentTypeCache
    }

    ldMethodFldInstr->Unlink();
    ldMethodFldInstr->m_opcode = Js::OpCode::LdMethodFldPolyInlineMiss;
    Assert(cachedFixedInlineeCount > 0);
    CompletePolymorphicInlining(callInstr, returnValueOpnd, doneLabel, dispatchStartLabel, ldMethodFldInstr, IR::BailOutOnFailedPolymorphicInlineTypeCheck);

    this->topFunc->SetHasInlinee();
    InsertStatementBoundary(instrNext);
    InsertStatementBoundary(ldMethodFldInstr);

    return instrNext;
}